

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::DoTrackCompoundedIntOverflow(BackwardPass *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  byte local_11;
  BackwardPass *this_local;
  
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,TrackCompoundedIntOverflowPhase,sourceContextId,
                     functionId);
  local_11 = 0;
  if (!bVar1) {
    bVar1 = DoTrackIntOverflow(this);
    local_11 = 0;
    if (bVar1) {
      bVar1 = Func::IsTrackCompoundedIntOverflowDisabled(this->func);
      local_11 = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
BackwardPass::DoTrackCompoundedIntOverflow() const
{
    return
        !PHASE_OFF(Js::TrackCompoundedIntOverflowPhase, func) &&
        DoTrackIntOverflow() && !func->IsTrackCompoundedIntOverflowDisabled();
}